

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::
SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
::erase(SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *this,uint *x)

{
  bool bVar1;
  uint *x_local;
  SmallSetBase<unsigned_int,_3UL,_wasm::OrderedFixedStorage<unsigned_int,_3UL>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *this_local;
  
  bVar1 = usingFixed(this);
  if (bVar1) {
    OrderedFixedStorage<unsigned_int,_3UL>::erase(&this->fixed,x);
  }
  else {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              (&this->flexible,x);
  }
  return;
}

Assistant:

void erase(const T& x) {
    if (usingFixed()) {
      fixed.erase(x);
    } else {
      flexible.erase(x);
    }
  }